

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::api::json::PsbtScriptData::PsbtScriptData(PsbtScriptData *this,PsbtScriptData *param_1)

{
  (this->super_JsonClassBase<cfd::api::json::PsbtScriptData>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtScriptData_002d05a0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  std::__cxx11::string::string((string *)&this->asm__,(string *)&param_1->asm__);
  std::__cxx11::string::string((string *)&this->hex_,(string *)&param_1->hex_);
  std::__cxx11::string::string((string *)&this->type_,(string *)&param_1->type_);
  return;
}

Assistant:

PsbtScriptData() {
    CollectFieldName();
  }